

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::BufferedFrameDeserializer::DecodeFrame
          (BufferedFrameDeserializer *this,char *data,size_t size)

{
  uint uVar1;
  IPCFrame *this_00;
  pointer pIVar2;
  value_type local_28;
  unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
  frame;
  size_t size_local;
  char *data_local;
  BufferedFrameDeserializer *this_local;
  
  if (size != 0) {
    frame._M_t.
    super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_*,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
    .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_*,_false>._M_head_impl =
         (__uniq_ptr_data<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>,_true,_true>
          )(__uniq_ptr_data<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>,_true,_true>
            )size;
    this_00 = (IPCFrame *)operator_new(0x78);
    protos::gen::IPCFrame::IPCFrame(this_00);
    ::std::
    unique_ptr<perfetto::protos::gen::IPCFrame,std::default_delete<perfetto::protos::gen::IPCFrame>>
    ::unique_ptr<std::default_delete<perfetto::protos::gen::IPCFrame>,void>
              ((unique_ptr<perfetto::protos::gen::IPCFrame,std::default_delete<perfetto::protos::gen::IPCFrame>>
                *)&local_28,this_00);
    pIVar2 = std::
             unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
             ::operator->((unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
                           *)&local_28);
    uVar1 = (*(pIVar2->super_CppMessageObj)._vptr_CppMessageObj[4])
                      (pIVar2,data,
                       frame._M_t.
                       super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_*,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
                       .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_*,_false>._M_head_impl
                      );
    if ((uVar1 & 1) != 0) {
      std::__cxx11::
      list<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
      ::push_back(&this->decoded_frames_,&local_28);
    }
    std::
    unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>
    ::~unique_ptr(&local_28);
  }
  return;
}

Assistant:

void BufferedFrameDeserializer::DecodeFrame(const char* data, size_t size) {
  if (size == 0)
    return;
  std::unique_ptr<Frame> frame(new Frame);
  if (frame->ParseFromArray(data, size))
    decoded_frames_.push_back(std::move(frame));
}